

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContinuumElastic::ComputeElasticStrain
          (ChContinuumElastic *this,ChStrainTensor<double> *mstrain,ChStressTensor<double> *mstress)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = this->v;
  dVar6 = 1.0 / this->E;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
  auVar1 = vfnmadd213sd_fma(auVar8,auVar11,auVar1);
  dVar7 = 0.5 / this->G;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [2];
  auVar1 = vfnmadd231sd_fma(auVar1,auVar11,auVar2);
  (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       dVar6 * auVar1._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = this->v;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1];
  auVar1 = vfnmadd213sd_fma(auVar9,auVar12,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [2];
  auVar1 = vfnmadd231sd_fma(auVar1,auVar12,auVar4);
  (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       dVar6 * auVar1._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this->v;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       this->v * (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1];
  auVar1 = vfnmsub231sd_fma(auVar13,auVar10,auVar5);
  (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       dVar6 * (auVar1._0_8_ +
               (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [2]);
  (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       dVar7 * (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3];
  (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       dVar7 * (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [4];
  (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       dVar7 * (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [5];
  return;
}

Assistant:

void ChContinuumElastic::ComputeElasticStrain(ChStrainTensor<>& mstrain, const ChStressTensor<>& mstress) const {
    double invE = 1. / E;
    double invhG = 0.5 / G;
    mstrain.XX() = invE * (mstress.XX() - mstress.YY() * v - mstress.ZZ() * v);
    mstrain.YY() = invE * (-mstress.XX() * v + mstress.YY() - mstress.ZZ() * v);
    mstrain.ZZ() = invE * (-mstress.XX() * v - mstress.YY() * v + mstress.ZZ());
    mstrain.XY() = mstress.XY() * invhG;
    mstrain.XZ() = mstress.XZ() * invhG;
    mstrain.YZ() = mstress.YZ() * invhG;
}